

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O3

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *
pstack::Procman::Process::procAddressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,string *fn)

{
  pointer pAVar1;
  optional<pstack::Procman::AddressRange::VmFlag> oVar2;
  char cVar3;
  int iVar4;
  uintmax_t uVar5;
  const_iterator cVar6;
  Exception *this;
  int *piVar7;
  Exception *rhs;
  ulong uVar8;
  size_t sVar9;
  string_view sVar10;
  string_view strv;
  string_view strv_00;
  string_view strv_01;
  string_view strv_02;
  string_view strv_03;
  string_view strv_04;
  string_view sv;
  long local_430;
  ifstream input;
  byte abStack_410 [488];
  undefined1 auStack_228 [8];
  value_type c;
  bool bStack_21c;
  undefined3 uStack_21b;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 local_200 [384];
  _Rb_tree<pstack::Procman::AddressRange::Permission,pstack::Procman::AddressRange::Permission,std::_Identity<pstack::Procman::AddressRange::Permission>,std::less<pstack::Procman::AddressRange::Permission>,std::allocator<pstack::Procman::AddressRange::Permission>>
  *local_80;
  _Optional_payload_base<pstack::Procman::AddressRange::VmFlag> local_78;
  optional<pstack::Procman::AddressRange::VmFlag> flag;
  string buf;
  string_view remains;
  undefined1 local_32;
  undefined1 local_31;
  
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
  reserve(__return_storage_ptr__,0x2800);
  flag.super__Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>._M_payload.
  super__Optional_payload_base<pstack::Procman::AddressRange::VmFlag> =
       (_Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>)&buf._M_string_length;
  buf._M_dataplus._M_p = (pointer)0x0;
  buf._M_string_length._0_1_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,0x400);
  std::ifstream::ifstream(&local_430,(string *)fn,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if ((cVar3 == '\0') || (*(int *)(abStack_410 + *(long *)(local_430 + -0x18)) != 0)) {
LAB_00122572:
    this = (Exception *)__cxa_allocate_exception(0x1a0);
    memset((Exception *)auStack_228,0,0x1a0);
    Exception::Exception((Exception *)auStack_228);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&c,"unable to open smaps file: ",0x1b);
    piVar7 = __errno_location();
    buf.field_2._8_8_ = strerror(*piVar7);
    rhs = Exception::operator<<((Exception *)auStack_228,(char **)((long)&buf.field_2 + 8));
    Exception::Exception(this,rhs);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  do {
    iVar4 = std::istream::peek();
    if (iVar4 == -1) break;
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + (char)(istream *)&local_430);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_430,(string *)&flag,cVar3);
    oVar2 = flag;
    buf.field_2._8_8_ = buf._M_dataplus._M_p;
    std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
    emplace_back<>(__return_storage_ptr__);
    pAVar1 = (__return_storage_ptr__->
             super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),'-');
    strv._M_str = sVar10._M_str;
    strv._M_len = (size_t)strv._M_str;
    uVar5 = hex2int((Procman *)sVar10._M_len,strv);
    pAVar1[-1].start = uVar5;
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),' ');
    strv_00._M_str = sVar10._M_str;
    strv_00._M_len = (size_t)strv_00._M_str;
    uVar5 = hex2int((Procman *)sVar10._M_len,strv_00);
    pAVar1[-1].end = uVar5;
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),' ');
    if ((procAddressSpace(std::__cxx11::string_const&)::flagmap == '\0') &&
       (iVar4 = __cxa_guard_acquire(&procAddressSpace(std::__cxx11::string_const&)::flagmap),
       iVar4 != 0)) {
      local_218 = 0x200000078;
      uStack_210 = 0x300000070;
      auStack_228 = (undefined1  [8])0x72;
      _c = (_Storage<pstack::Procman::AddressRange::VmFlag,_true>)0x77;
      bStack_21c = true;
      uStack_21b = 0;
      local_208 = 0x500000073;
      std::
      _Hashtable<char,std::pair<char_const,pstack::Procman::AddressRange::Permission>,std::allocator<std::pair<char_const,pstack::Procman::AddressRange::Permission>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<char_const,pstack::Procman::AddressRange::Permission>const*>
                ((_Hashtable<char,std::pair<char_const,pstack::Procman::AddressRange::Permission>,std::allocator<std::pair<char_const,pstack::Procman::AddressRange::Permission>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&procAddressSpace::flagmap,(string_view *)auStack_228,local_200,0,&local_78,
                 &local_32,&local_31);
      __cxa_atexit(std::
                   unordered_map<char,_pstack::Procman::AddressRange::Permission,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>_>
                   ::~unordered_map,&procAddressSpace::flagmap,&__dso_handle);
      __cxa_guard_release(&procAddressSpace(std::__cxx11::string_const&)::flagmap);
    }
    if (sVar10._M_len != 0) {
      local_80 = (_Rb_tree<pstack::Procman::AddressRange::Permission,pstack::Procman::AddressRange::Permission,std::_Identity<pstack::Procman::AddressRange::Permission>,std::less<pstack::Procman::AddressRange::Permission>,std::allocator<pstack::Procman::AddressRange::Permission>>
                  *)&pAVar1[-1].permissions;
      sVar9 = 0;
      do {
        auStack_228[0] = sVar10._M_str[sVar9];
        if (sVar10._M_str[sVar9] != '-') {
          cVar6 = std::
                  _Hashtable<char,_std::pair<const_char,_pstack::Procman::AddressRange::Permission>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&procAddressSpace::flagmap._M_h,(key_type_conflict1 *)auStack_228);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_char,_pstack::Procman::AddressRange::Permission>,_false>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
            goto LAB_0012255d;
          }
          std::
          _Rb_tree<pstack::Procman::AddressRange::Permission,pstack::Procman::AddressRange::Permission,std::_Identity<pstack::Procman::AddressRange::Permission>,std::less<pstack::Procman::AddressRange::Permission>,std::allocator<pstack::Procman::AddressRange::Permission>>
          ::_M_insert_unique<pstack::Procman::AddressRange::Permission_const&>
                    (local_80,(Permission *)
                              ((long)cVar6.
                                     super__Node_iterator_base<std::pair<const_char,_pstack::Procman::AddressRange::Permission>,_false>
                                     ._M_cur + 0xc));
        }
        sVar9 = sVar9 + 1;
      } while (sVar10._M_len != sVar9);
    }
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),' ');
    strv_01._M_str = sVar10._M_str;
    strv_01._M_len = (size_t)strv_01._M_str;
    uVar5 = hex2int((Procman *)sVar10._M_len,strv_01);
    pAVar1[-1].offset = uVar5;
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),':');
    strv_02._M_str = sVar10._M_str;
    strv_02._M_len = (size_t)strv_02._M_str;
    uVar5 = hex2int((Procman *)sVar10._M_len,strv_02);
    pAVar1[-1].backing.major = (int)uVar5;
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),' ');
    strv_03._M_str = sVar10._M_str;
    strv_03._M_len = (size_t)strv_03._M_str;
    uVar5 = hex2int((Procman *)sVar10._M_len,strv_03);
    pAVar1[-1].backing.minor = (int)uVar5;
    sVar10 = nextTok<char>((string_view *)((long)&buf.field_2 + 8),' ');
    strv_04._M_str = sVar10._M_str;
    strv_04._M_len = (size_t)strv_04._M_str;
    uVar5 = hex2int((Procman *)sVar10._M_len,strv_04);
    pAVar1[-1].backing.inode = uVar5;
    if (buf.field_2._8_8_ != 0) {
      uVar8 = 0;
      do {
        if (*(char *)((long)oVar2.
                            super__Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>.
                            _M_payload.
                            super__Optional_payload_base<pstack::Procman::AddressRange::VmFlag> +
                     uVar8) != ' ') {
          if (uVar8 != 0xffffffffffffffff) {
            if ((ulong)buf.field_2._8_8_ < uVar8) goto LAB_0012255d;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&pAVar1[-1].backing.path,0,pAVar1[-1].backing.path._M_string_length,
                       (char *)((long)oVar2.
                                      super__Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<pstack::Procman::AddressRange::VmFlag>
                               + uVar8),buf.field_2._8_8_ - uVar8);
            goto LAB_001223a9;
          }
          break;
        }
        uVar8 = uVar8 + 1;
      } while (buf.field_2._8_8_ != uVar8);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&pAVar1[-1].backing.path,0,pAVar1[-1].backing.path._M_string_length,"<anon>",6);
LAB_001223a9:
    while( true ) {
      iVar4 = std::istream::peek();
      iVar4 = isupper(iVar4);
      if (iVar4 == 0) break;
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_430 + -0x18) + (char)(istream *)&local_430
                             );
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_430,(string *)&flag,cVar3);
      auStack_228 = (undefined1  [8])buf._M_dataplus._M_p;
      _c = (_Optional_payload_base<pstack::Procman::AddressRange::VmFlag>)
           flag.super__Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>._M_payload.
           super__Optional_payload_base<pstack::Procman::AddressRange::VmFlag>;
      sVar10 = nextTok<char>((string_view *)auStack_228,':');
      if ((sVar10._M_len == 7) &&
         (*(int *)((long)sVar10._M_str + 3) == 0x7367616c && *(int *)sVar10._M_str == 0x6c466d56)) {
        while( true ) {
          sVar10 = nextTok<char>((string_view *)auStack_228,' ');
          sv._M_str = sVar10._M_str;
          if ((AddressRange *)sVar10._M_len == (AddressRange *)0x0) break;
          sv._M_len = (size_t)sv._M_str;
          local_78 = (_Optional_payload_base<pstack::Procman::AddressRange::VmFlag>)
                     AddressRange::vmflag((AddressRange *)sVar10._M_len,sv);
          if (((ulong)local_78 >> 0x20 & 1) != 0) {
            std::
            _Rb_tree<pstack::Procman::AddressRange::VmFlag,pstack::Procman::AddressRange::VmFlag,std::_Identity<pstack::Procman::AddressRange::VmFlag>,std::less<pstack::Procman::AddressRange::VmFlag>,std::allocator<pstack::Procman::AddressRange::VmFlag>>
            ::_M_insert_unique<pstack::Procman::AddressRange::VmFlag_const&>
                      ((_Rb_tree<pstack::Procman::AddressRange::VmFlag,pstack::Procman::AddressRange::VmFlag,std::_Identity<pstack::Procman::AddressRange::VmFlag>,std::less<pstack::Procman::AddressRange::VmFlag>,std::allocator<pstack::Procman::AddressRange::VmFlag>>
                        *)&pAVar1[-1].vmflags,(VmFlag *)&local_78);
          }
        }
      }
    }
  } while ((abStack_410[*(long *)(local_430 + -0x18)] & 5) == 0);
  std::ifstream::~ifstream(&local_430);
  if (flag.super__Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>._M_payload.
      super__Optional_payload_base<pstack::Procman::AddressRange::VmFlag> !=
      (_Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>)&buf._M_string_length) {
    operator_delete((void *)flag.
                            super__Optional_base<pstack::Procman::AddressRange::VmFlag,_true,_true>.
                            _M_payload.
                            super__Optional_payload_base<pstack::Procman::AddressRange::VmFlag>,
                    CONCAT71(buf._M_string_length._1_7_,(undefined1)buf._M_string_length) + 1);
  }
  return __return_storage_ptr__;
LAB_0012255d:
  std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > __size (which is %zu)");
  goto LAB_00122572;
}

Assistant:

std::vector<AddressRange>
Process::procAddressSpace(const std::string &fn) {
    std::vector<AddressRange> rv;
    // there can be many mappings, and we don't call this very often, so
    // pre-allocate the space we need.
    rv.reserve(10240);

    std::string buf;
    buf.reserve( 1024 );
    std::ifstream input{fn};
    if ( !input.is_open() || !input.good()){
         throw ( Exception() << "unable to open smaps file: " << strerror(errno) );
    }
    while (input && input.peek() != EOF) {
       // We could just use operator>> to stream each field of the line to the
       // relevant fields, but it is ridiculously slow, I Think mostly because
       // of the use of std::hex invoking std::use_facet, which uses dynamic
       // casts. So, instead, parse out the line the hard way. This first line
       // includes details of the address range covered, and some basic
       // details. The /proc/<pid>/maps file includes just these lines.
       std::getline( input, buf );
       std::string_view remains{ buf };

       rv.emplace_back();
       AddressRange &range = rv.back();
       range.start = hex2int(nextTok( remains, '-' ));
       range.end = hex2int(nextTok( remains, ' ' ));

       std::string_view  perms = nextTok( remains, ' ' );

       static const std::unordered_map<char, AddressRange::Permission> flagmap {
           { 'r', AddressRange::Permission::read },
           { 'w', AddressRange::Permission::write },
           { 'x', AddressRange::Permission::exec },
           { 'p', AddressRange::Permission::priv },
           { 's', AddressRange::Permission::shared },
       };
       for (auto c : perms)
           if (c != '-')
               range.permissions.insert(flagmap.at(c));

       range.offset = hex2int(nextTok( remains, ' ' ));

       auto &backing = range.backing;
       backing.major = hex2int(nextTok( remains, ':' ));
       backing.minor = hex2int(nextTok( remains, ' ' ));
       backing.inode = hex2int(nextTok( remains, ' ' ));

       size_t trim = remains.find_first_not_of(" ");
       if ( trim != std::string::npos ) {
          backing.path = remains.substr( trim );
       } else {
          backing.path = "<anon>";
       }

       // Now process the attribute lines under the details of the range. These
       // are only present for /proc/<pid>/smaps.

       while (isupper(input.peek())) {
          std::getline(input, buf);
          std::string_view lineview { buf };
          auto key = nextTok( lineview, ':' );
          if (key == "VmFlags") {
             for (;;) {
                auto tok = nextTok( lineview, ' ' );
                if (tok == "")
                   break;
                auto flag = AddressRange::vmflag(tok);
                if (flag)
                   range.vmflags.insert( *flag );
             }
          }
       }
    }
    return rv;
}